

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::ArticulatedPart::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ArticulatedPart *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Articulation Parameters:");
  poVar1 = std::operator<<(poVar1,"\n\tParameter Change:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8ParmeterChange);
  poVar1 = std::operator<<(poVar1,"\n\tAttachement ID:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16AttachementID);
  poVar1 = std::operator<<(poVar1,"\n\tType Metric:          ");
  ENUMS::GetEnumAsStringArticulatedPartsMetric_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)(this->m_ui32ParamTypeVariant & 0x1f),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tType High Bits:       ");
  ENUMS::GetEnumAsStringArticulatedPartsClass_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)(this->m_ui32ParamTypeVariant & 0xffffffe0),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tValue:                ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32ParamValue);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ArticulatedPart::GetAsString() const
{
    KStringStream ss;

    ss << "Articulation Parameters:"
       << "\n\tParameter Change:     " << ( KUINT16 )m_ui8ParmeterChange
       << "\n\tAttachement ID:       " << m_ui16AttachementID
       << "\n\tType Metric:          " << GetEnumAsStringArticulatedPartsMetric( GetTypeVariantMetric() )
       << "\n\tType High Bits:       " << GetEnumAsStringArticulatedPartsClass( GetTypeVariantClass() )
       << "\n\tValue:                " << m_f32ParamValue
       << "\n";

    return ss.str();
}